

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

size_t quantize_q6_K(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ggml_fp16_t gVar5;
  int ib_1;
  size_t sVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  int8_t *piVar14;
  int ib;
  long lVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  float *in_R9;
  long lVar19;
  long lVar20;
  float *pfVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float *local_208;
  float local_1f8;
  float *local_1d0;
  float afStack_178 [16];
  int8_t L [256];
  
  sVar6 = ggml_row_size(GGML_TYPE_Q6_K,n_per_row);
  if (quant_weights == (float *)0x0) {
    quantize_row_q6_K_ref(src,(block_q6_K *)dst,n_per_row * nrow);
  }
  else {
    lVar11 = 0;
    lVar7 = n_per_row / 0x100;
    if (n_per_row / 0x100 < 1) {
      lVar7 = lVar11;
    }
    lVar8 = 0;
    if (0 < nrow) {
      lVar8 = nrow;
    }
    lVar20 = (long)dst + 0xc0;
    local_208 = src;
    for (; lVar11 != lVar8; lVar11 = lVar11 + 1) {
      pfVar12 = local_208;
      lVar19 = lVar20;
      local_1d0 = quant_weights;
      for (lVar9 = 0; lVar9 != lVar7; lVar9 = lVar9 + 1) {
        piVar14 = L;
        local_1f8 = 0.0;
        pfVar13 = pfVar12;
        pfVar21 = local_1d0;
        fVar25 = 0.0;
        for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
          fVar22 = make_qx_quants(0x10,0x20,pfVar13,piVar14,(int)pfVar21,in_R9);
          afStack_178[lVar15] = fVar22;
          fVar24 = ABS(fVar22);
          fVar23 = fVar24;
          if (fVar24 <= fVar25) {
            fVar23 = fVar25;
          }
          local_1f8 = (float)(~-(uint)(fVar25 < fVar24) & (uint)local_1f8 |
                             (uint)fVar22 & -(uint)(fVar25 < fVar24));
          piVar14 = piVar14 + 0x10;
          pfVar13 = pfVar13 + 0x10;
          pfVar21 = pfVar21 + 0x10;
          fVar25 = fVar23;
        }
        if (1e-15 <= fVar25) {
          gVar5 = ggml_compute_fp32_to_fp16(1.0 / (-128.0 / local_1f8));
          pvVar10 = (void *)(lVar9 * 0xd2 + (long)dst);
          *(ggml_fp16_t *)((long)dst + lVar9 * 0xd2 + 0xd0) = gVar5;
          for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
            fVar23 = afStack_178[lVar15] * (-128.0 / local_1f8) + 12582912.0;
            fVar25 = 1.77965e-43;
            if (((uint)fVar23 & 0x7fff80) < 0x400080) {
              fVar25 = fVar23;
            }
            *(char *)(lVar19 + lVar15) = SUB41(fVar25,0);
          }
          fVar25 = ggml_table_f32_f16[*(ushort *)((long)pvVar10 + 0xd0)];
          piVar14 = L;
          pfVar13 = pfVar12;
          for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
            fVar23 = (float)(int)*(char *)((long)pvVar10 + lVar15 + 0xc0) * fVar25;
            if ((fVar23 != 0.0) || (NAN(fVar23))) {
              for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
                uVar18 = (uint)(pfVar13[lVar17] / fVar23 + 12582912.0) & 0x7fffff;
                in_R9 = (float *)0x40001f;
                if (0x40001e < uVar18) {
                  uVar18 = 0x40001f;
                }
                if (uVar18 < 0x3fffe1) {
                  uVar18 = 0x3fffe0;
                }
                piVar14[lVar17] = (char)uVar18 + ' ';
              }
            }
            pfVar13 = pfVar13 + 0x10;
            piVar14 = piVar14 + 0x10;
          }
          lVar15 = (long)pvVar10 + 0x80;
          piVar14 = L + 0x60;
          for (uVar16 = 0; uVar16 < 0x100; uVar16 = uVar16 + 0x80) {
            for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 1) {
              bVar1 = piVar14[lVar17 + -0x60];
              bVar2 = piVar14[lVar17 + -0x40];
              bVar3 = piVar14[lVar17 + -0x20];
              bVar4 = piVar14[lVar17];
              *(byte *)((long)pvVar10 + lVar17) = bVar3 << 4 | bVar1 & 0xf;
              *(byte *)((long)pvVar10 + lVar17 + 0x20) = bVar4 << 4 | bVar2 & 0xf;
              in_R9 = (float *)(CONCAT71((int7)((ulong)in_R9 >> 8),(char)bVar2 >> 2) &
                               0xfffffffffffffffc);
              *(byte *)(lVar15 + lVar17) =
                   (bVar4 & 0x30) << 2 | bVar3 & 0xf0 | (char)bVar1 >> 4 | (byte)in_R9;
            }
            pvVar10 = (void *)((long)pvVar10 + 0x40);
            lVar15 = lVar15 + 0x20;
            piVar14 = piVar14 + 0x80;
          }
        }
        else {
          memset((void *)(lVar9 * 0xd2 + (long)dst),0,0xd2);
        }
        pfVar12 = pfVar12 + 0x100;
        local_1d0 = local_1d0 + 0x100;
        lVar19 = lVar19 + 0xd2;
      }
      local_208 = local_208 + n_per_row;
      dst = (void *)((long)dst + sVar6);
      lVar20 = lVar20 + sVar6;
    }
  }
  return sVar6 * nrow;
}

Assistant:

size_t quantize_q6_K(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    size_t row_size = ggml_row_size(GGML_TYPE_Q6_K, n_per_row);
    if (!quant_weights) {
        quantize_row_q6_K_ref(src, dst, (int64_t)nrow*n_per_row);
    }
    else {
        char * qrow = (char *)dst;
        for (int64_t row = 0; row < nrow; ++row) {
            quantize_row_q6_K_impl(src, (block_q6_K*)qrow, n_per_row, quant_weights);
            src += n_per_row;
            qrow += row_size;
        }
    }
    return nrow * row_size;
}